

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_mapinfo.cpp
# Opt level: O0

void MapOptHandler_defaultenvironment(FMapInfoParser *parse,level_info_t *info)

{
  bool bVar1;
  ReverbContainer *pRVar2;
  ReverbContainer *reverb;
  int id;
  level_info_t *info_local;
  FMapInfoParser *parse_local;
  
  FMapInfoParser::ParseAssign(parse);
  bVar1 = FScanner::CheckNumber(&parse->sc);
  if (bVar1) {
    reverb._4_4_ = (parse->sc).Number << 8;
    bVar1 = FMapInfoParser::CheckNumber(parse);
    if (bVar1) {
      reverb._4_4_ = (parse->sc).Number | reverb._4_4_;
    }
  }
  else {
    FScanner::MustGetString(&parse->sc);
    pRVar2 = S_FindEnvironment((parse->sc).String);
    if (pRVar2 == (ReverbContainer *)0x0) {
      FScanner::ScriptMessage(&parse->sc,"Unknown sound environment \'%s\'\n",(parse->sc).String);
      reverb._4_4_ = 0;
    }
    else {
      reverb._4_4_ = (uint)pRVar2->ID;
    }
  }
  info->DefaultEnvironment = reverb._4_4_;
  return;
}

Assistant:

DEFINE_MAP_OPTION(defaultenvironment, false)
{
	int id;

	parse.ParseAssign();
	if (parse.sc.CheckNumber())
	{ // Numeric ID XXX [, YYY]
		id = parse.sc.Number << 8;
		if (parse.CheckNumber())
		{
			id |= parse.sc.Number;
		}
	}
	else
	{ // Named environment
		parse.sc.MustGetString();
		ReverbContainer *reverb = S_FindEnvironment(parse.sc.String);
		if (reverb == NULL)
		{
			parse.sc.ScriptMessage("Unknown sound environment '%s'\n", parse.sc.String);
			id = 0;
		}
		else
		{
			id = reverb->ID;
		}
	}
	info->DefaultEnvironment = id;
}